

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

bool __thiscall MemoryManager::addPage(MemoryManager *this,uint32_t addr)

{
  uint8_t *puVar1;
  uint8_t **__s;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = addr >> 0x16;
  uVar3 = addr >> 0xc & 0x3ff;
  __s = this->memory[uVar5];
  if (__s == (uint8_t **)0x0) {
    __s = (uint8_t **)operator_new__(0x2000);
    this->memory[uVar5] = __s;
    memset(__s,0,0x2000);
  }
  puVar1 = __s[uVar3];
  if (puVar1 == (uint8_t *)0x0) {
    pvVar2 = operator_new__(0x1000);
    uVar4 = (ulong)(uVar3 << 3);
    *(void **)((long)__s + uVar4) = pvVar2;
    memset(*(void **)((long)this->memory[uVar5] + uVar4),0,0x1000);
  }
  else {
    dbgprintf("Addr 0x%x already exists and do not need an addPage()!\n",addr);
  }
  return puVar1 == (uint8_t *)0x0;
}

Assistant:

bool MemoryManager::addPage(uint32_t addr) {
  uint32_t i = this->getFirstEntryId(addr);
  uint32_t j = this->getSecondEntryId(addr);
  if (this->memory[i] == nullptr) {
    this->memory[i] = new uint8_t *[1024];
    memset(this->memory[i], 0, sizeof(uint8_t *) * 1024);
  }
  if (this->memory[i][j] == nullptr) {
    this->memory[i][j] = new uint8_t[4096];
    memset(this->memory[i][j], 0, 4096);
  } else {
    dbgprintf("Addr 0x%x already exists and do not need an addPage()!\n", addr);
    return false;
  }
  return true;
}